

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseEnumConstant
          (Parser *this,EnumValueDescriptorProto *enum_value,LocationRecorder *enum_value_location,
          FileDescriptorProto *containing_file)

{
  ulong uVar1;
  bool bVar2;
  string *output;
  undefined8 *puVar3;
  int number;
  LocationRecorder location;
  int32_t local_4c;
  LocationRecorder local_48;
  
  LocationRecorder::LocationRecorder(&local_48,enum_value_location,1);
  LocationRecorder::RecordLegacyLocation(&local_48,&enum_value->super_Message,NAME);
  *(byte *)(enum_value->_has_bits_).has_bits_ = (byte)(enum_value->_has_bits_).has_bits_[0] | 1;
  uVar1 = (enum_value->super_Message).super_MessageLite._internal_metadata_.ptr_;
  puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar3 = (undefined8 *)*puVar3;
  }
  output = internal::ArenaStringPtr::Mutable_abi_cxx11_(&enum_value->name_,puVar3);
  bVar2 = ConsumeIdentifier(this,output,"Expected enum constant name.");
  LocationRecorder::~LocationRecorder(&local_48);
  if ((bVar2) && (bVar2 = Consume(this,"=","Missing numeric value for enum constant."), bVar2)) {
    LocationRecorder::LocationRecorder(&local_48,enum_value_location,2);
    LocationRecorder::RecordLegacyLocation(&local_48,&enum_value->super_Message,NUMBER);
    bVar2 = ConsumeSignedInteger(this,&local_4c,"Expected integer.");
    if (bVar2) {
      (enum_value->_has_bits_).has_bits_[0] = (enum_value->_has_bits_).has_bits_[0] | 4;
      enum_value->number_ = local_4c;
      LocationRecorder::~LocationRecorder(&local_48);
      bVar2 = ParseEnumConstantOptions(this,enum_value,enum_value_location,containing_file);
      if (bVar2) {
        bVar2 = ConsumeEndOfDeclaration(this,";",enum_value_location);
        return bVar2;
      }
    }
    else {
      LocationRecorder::~LocationRecorder(&local_48);
    }
  }
  return false;
}

Assistant:

bool Parser::ParseEnumConstant(EnumValueDescriptorProto* enum_value,
                               const LocationRecorder& enum_value_location,
                               const FileDescriptorProto* containing_file) {
  // Parse name.
  {
    LocationRecorder location(enum_value_location,
                              EnumValueDescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(enum_value,
                                  DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(enum_value->mutable_name(),
                         "Expected enum constant name."));
  }

  DO(Consume("=", "Missing numeric value for enum constant."));

  // Parse value.
  {
    LocationRecorder location(enum_value_location,
                              EnumValueDescriptorProto::kNumberFieldNumber);
    location.RecordLegacyLocation(enum_value,
                                  DescriptorPool::ErrorCollector::NUMBER);

    int number;
    DO(ConsumeSignedInteger(&number, "Expected integer."));
    enum_value->set_number(number);
  }

  DO(ParseEnumConstantOptions(enum_value, enum_value_location,
                              containing_file));

  DO(ConsumeEndOfDeclaration(";", &enum_value_location));

  return true;
}